

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSFFile.cpp
# Opt level: O2

PSFFile * PSFFile::load(string *filename)

{
  uint8_t uVar1;
  uint8_t auVar2 [4];
  uint8_t auVar3 [4];
  byte *pbVar4;
  byte *pbVar5;
  __type _Var6;
  int iVar7;
  uint8_t auVar8 [4];
  FILE *__stream;
  size_t sVar9;
  PSFFile *this;
  void *__ptr;
  byte *pbVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte *pbVar13;
  iterator __pos;
  byte *pbVar14;
  byte *pbVar15;
  ulong __n;
  byte *pbVar16;
  size_t i;
  ulong uVar17;
  ulong __n_00;
  ulong uVar18;
  byte *__n_01;
  uint8_t data [4];
  uint8_t sig [3];
  uint8_t tag_marker [5];
  string tag_var_value;
  string tag_var_name;
  stat st;
  
  iVar7 = stat((filename->_M_dataplus)._M_p,(stat *)&st);
  uVar18 = -(ulong)(iVar7 != 0) | st.st_size;
  if ((long)uVar18 < 0) {
    return (PSFFile *)0x0;
  }
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream != (FILE *)0x0) {
    sVar9 = fread(sig,1,3,__stream);
    if (((sVar9 == 3) && (iVar7 = bcmp(sig,"PSF",3), iVar7 == 0)) &&
       (sVar9 = fread(data,1,1,__stream), sVar9 == 1)) {
      uVar1 = data[0];
      sVar9 = fread(data,1,4,__stream);
      auVar2 = data;
      if (sVar9 == 4) {
        __n = (ulong)(uint)data;
        sVar9 = fread(data,1,4,__stream);
        auVar3 = data;
        if (sVar9 == 4) {
          __n_00 = (ulong)(uint)data;
          sVar9 = fread(data,1,4,__stream);
          if ((sVar9 == 4) && ((int)auVar2 + (int)auVar3 + 0x10 <= uVar18)) {
            this = (PSFFile *)operator_new(0x110);
            PSFFile(this);
            this->version = uVar1;
            __ptr = operator_new__(__n);
            sVar9 = fread(__ptr,1,__n,__stream);
            if (sVar9 == __n) {
              for (uVar17 = 0; __n != uVar17; uVar17 = uVar17 + 1) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                          (&this->reserved,(value_type_conflict1 *)((long)__ptr + uVar17));
              }
              operator_delete__(__ptr);
              __ptr = operator_new__(__n_00);
              sVar9 = fread(__ptr,1,__n_00,__stream);
              if ((sVar9 == __n_00) &&
                 (auVar8 = (uint8_t  [4])ZlibReader::crc32(__ptr,__n_00), auVar8 == data)) {
                ZlibReader::assign(&this->compressed_exe,__ptr,__n_00);
                operator_delete__(__ptr);
                sVar9 = fread(tag_marker,1,5,__stream);
                if ((sVar9 != 5) || (iVar7 = bcmp(tag_marker,"[TAG]",5), iVar7 != 0)) {
LAB_00106b35:
                  fclose(__stream);
                  return this;
                }
                __n_01 = (byte *)(uVar18 - ((int)auVar2 + (int)auVar3 + 0x15));
                __ptr = operator_new__((ulong)(__n_01 + 1));
                pbVar10 = (byte *)fread(__ptr,1,(size_t)__n_01,__stream);
                if (pbVar10 == __n_01) {
                  *(byte *)((long)__ptr + (long)__n_01) = 0;
                  pbVar10 = (byte *)0x0;
                  while (pbVar10 < __n_01) {
                    pbVar10 = pbVar10 + (long)__ptr;
                    pbVar11 = (byte *)strchr((char *)pbVar10,10);
                    if (pbVar11 == (byte *)0x0) {
                      pbVar11 = __n_01 + (long)__ptr;
                    }
                    *pbVar11 = 0;
                    pbVar12 = (byte *)strchr((char *)pbVar10,0x3d);
                    if (pbVar12 != (byte *)0x0) {
                      pbVar16 = pbVar12 + 1;
                      pbVar15 = pbVar12;
                      do {
                        pbVar14 = pbVar15;
                        pbVar13 = pbVar12;
                        pbVar4 = pbVar11;
                        pbVar5 = pbVar11;
                        if (pbVar14 <= pbVar10) break;
                        pbVar12 = pbVar13 + -1;
                        pbVar15 = pbVar14 + -1;
                      } while (pbVar14[-1] < 0x21);
                      do {
                        pbVar15 = pbVar5;
                        pbVar12 = pbVar4;
                        if (pbVar15 <= pbVar16) break;
                        pbVar4 = pbVar12 + -1;
                        pbVar5 = pbVar15 + -1;
                      } while (pbVar15[-1] < 0x21);
                      for (; (pbVar10 < pbVar14 && (*pbVar10 < 0x21)); pbVar10 = pbVar10 + 1) {
                      }
                      for (; (pbVar16 < pbVar15 && (*pbVar16 < 0x21)); pbVar16 = pbVar16 + 1) {
                      }
                      tag_var_name._M_dataplus._M_p = (pointer)&tag_var_name.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&tag_var_name,pbVar10,pbVar13);
                      tag_var_value._M_dataplus._M_p = (pointer)&tag_var_value.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&tag_var_value,pbVar16,pbVar12);
                      __pos = std::
                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::lower_bound(&(this->tags)._M_t,&tag_var_name);
                      if (((_Rb_tree_header *)__pos._M_node ==
                           &(this->tags)._M_t._M_impl.super__Rb_tree_header) ||
                         (_Var6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(__pos._M_node + 1),&tag_var_name), !_Var6)) {
                        std::
                        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::
                        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&st,&tag_var_name,&tag_var_value);
                        std::
                        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        ::
                        _M_emplace_hint_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                    *)&this->tags,(const_iterator)__pos._M_node,
                                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&st);
                        std::
                        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&st);
                      }
                      else {
                        std::__cxx11::string::append((char *)(__pos._M_node + 2));
                        std::__cxx11::string::append((string *)(__pos._M_node + 2));
                      }
                      std::__cxx11::string::~string((string *)&tag_var_value);
                      std::__cxx11::string::~string((string *)&tag_var_name);
                    }
                    pbVar10 = pbVar11 + (1 - (long)__ptr);
                  }
                  operator_delete__(__ptr);
                  goto LAB_00106b35;
                }
              }
            }
            operator_delete__(__ptr);
            (*this->_vptr_PSFFile[1])(this);
          }
        }
      }
    }
    fclose(__stream);
  }
  return (PSFFile *)0x0;
}

Assistant:

PSFFile * PSFFile::load(const std::string& filename)
{
	uint8_t data[4];

	off_t off_psf_size = path_getfilesize(filename.c_str());
	if (off_psf_size < 0)
	{
		return NULL;
	}
	size_t psf_size = (size_t) off_psf_size;

	FILE * fp = fopen(filename.c_str(), "rb");
	if (fp == NULL)
	{
		return NULL;
	}

	// signature
	uint8_t sig[PSF_SIGNATURE_SIZE];
	if (fread(sig, 1, PSF_SIGNATURE_SIZE, fp) != PSF_SIGNATURE_SIZE)
	{
		fclose(fp);
		return NULL;
	}
	if (memcmp(sig, PSF_SIGNATURE, PSF_SIGNATURE_SIZE) != 0)
	{
		fclose(fp);
		return NULL;
	}

	// version number
	if (fread(data, 1, 1, fp) != 1)
	{
		fclose(fp);
		return NULL;
	}
	uint8_t version = data[0];

	// size of reserved area
	if (fread(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return NULL;
	}
	uint32_t reserved_size = data[0] | (data[1] << 8) | (data[2] << 16) | (data[3] << 24);

	// size of compressed program
	if (fread(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return NULL;
	}
	uint32_t compressed_exe_size = data[0] | (data[1] << 8) | (data[2] << 16) | (data[3] << 24);

	// crc32 of compressed program
	if (fread(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return NULL;
	}
	uint32_t compressed_exe_crc_expected = data[0] | (data[1] << 8) | (data[2] << 16) | (data[3] << 24);

	// check the size consistency beforehand
	if (0x10 + reserved_size + compressed_exe_size > psf_size)
	{
		fclose(fp);
		return NULL;
	}

	// create new PSF object
	PSFFile * psf = new PSFFile();
	psf->version = version;

	// reserved area
	uint8_t * reserved_data = new uint8_t[reserved_size];
	if (fread(reserved_data, 1, reserved_size, fp) != reserved_size)
	{
		delete [] reserved_data;
		delete psf;
		fclose(fp);
		return NULL;
	}
	// set to vector
	for (size_t i = 0; i < reserved_size; i++)
	{
		psf->reserved.push_back(reserved_data[i]);
	}
	delete [] reserved_data;

	// compressed exe
	uint8_t * compressed_exe_data = new uint8_t[compressed_exe_size];
	if (fread(compressed_exe_data, 1, compressed_exe_size, fp) != compressed_exe_size)
	{
		delete [] compressed_exe_data;
		delete psf;
		fclose(fp);
		return NULL;
	}
	// test crc32
	uint32_t compressed_exe_crc = ZlibReader::crc32(compressed_exe_data, compressed_exe_size);
	if (compressed_exe_crc != compressed_exe_crc_expected)
	{
		delete [] compressed_exe_data;
		delete psf;
		fclose(fp);
		return NULL;
	}
	// set to ZlibReader
	psf->compressed_exe.assign(compressed_exe_data, compressed_exe_size);
	delete [] compressed_exe_data;

	// check tag marker (optional)
	uint8_t tag_marker[PSF_TAG_MARKER_SIZE];
	if (fread(tag_marker, 1, PSF_TAG_MARKER_SIZE, fp) != PSF_TAG_MARKER_SIZE)
	{
		// no tags
		fclose(fp);
		return psf;
	}
	if (memcmp(tag_marker, PSF_TAG_MARKER, PSF_TAG_MARKER_SIZE) != 0)
	{
		// no tags
		fclose(fp);
		return psf;
	}

	// read entire tag area
	size_t tag_size = psf_size - (0x10 + reserved_size + compressed_exe_size + PSF_TAG_MARKER_SIZE);
	char * tag_chrs = new char[tag_size + 1];
	if (fread(tag_chrs, 1, tag_size, fp) != tag_size)
	{
		// I/O error
		delete [] tag_chrs;
		delete psf;
		fclose(fp);
		return NULL;
	}
	tag_chrs[tag_size] = '\0';

	// Parse tag section. Details are available here:
	// http://wiki.neillcorlett.com/PSFTagFormat
	size_t off_curtag = 0;
	while (off_curtag < tag_size)
	{
		// Search the end position of the current line.
		char* ptr_newline = strchr(&tag_chrs[off_curtag], 0x0a);
		if (ptr_newline == NULL)
		{
			// Tag section must end with a newline.
			// Read the all remaining bytes if a newline lacks though.
			ptr_newline = tag_chrs + tag_size;
		}

		// Replace the newline with NUL,
		// for better C string function compatibility.
		*ptr_newline = '\0';

		// Search the variable=value separator.
		char* ptr_separator = strchr(&tag_chrs[off_curtag], '=');
		if (ptr_separator == NULL)
		{
			// Blank lines, or lines not of the form "variable=value", are ignored.
			off_curtag = ptr_newline + 1 - tag_chrs;
			continue;
		}

		// Determine the start/end position of variable.
		char* ptr_name = &tag_chrs[off_curtag];
		char* ptr_name_end = ptr_separator;
		char* ptr_value = ptr_separator + 1;
		char* ptr_value_end = ptr_newline;

		// Whitespace at the beginning/end of the line and before/after the = are ignored.
		// All characters 0x01-0x20 are considered whitespace.
		// (There must be no null (0x00) characters.)
		// Trim them.
		while (ptr_name_end > ptr_name && *(unsigned char*)(ptr_name_end - 1) <= 0x20)
			ptr_name_end--;
		while (ptr_value_end > ptr_value && *(unsigned char*)(ptr_value_end - 1) <= 0x20)
			ptr_value_end--;
		while (ptr_name < ptr_name_end && *(unsigned char*)ptr_name <= 0x20)
			ptr_name++;
		while (ptr_value < ptr_value_end && *(unsigned char*)ptr_value <= 0x20)
			ptr_value++;

		// Read variable=value as string.
		std::string tag_var_name(ptr_name, ptr_name_end - ptr_name);
		std::string tag_var_value(ptr_value, ptr_value_end - ptr_value);

		// Multiple-line variables must appear as consecutive lines using the same variable name.
		// For instance:
		//   comment=This is a
		//   comment=multiple-line
		//   comment=comment.
		// Therefore, check if the variable had already appeared.
		std::map<std::string, std::string>::iterator it = psf->tags.lower_bound(tag_var_name);
		if (it != psf->tags.end() && it->first == tag_var_name)
		{
			it->second += "\n";
			it->second += tag_var_value;
		}
		else
		{
			psf->tags.insert(it, make_pair(tag_var_name, tag_var_value));
		}

		off_curtag = ptr_newline + 1 - tag_chrs;
	}
	delete[] tag_chrs;
	fclose(fp);

	return psf;
}